

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O0

void __thiscall QColumnViewGrip::mouseDoubleClickEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  bool bVar1;
  uint uVar2;
  QObject *pQVar3;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QColumnViewGrip *unaff_retaddr;
  int offset;
  QWidget *parentWidget;
  int local_2c;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QObject::parent((QObject *)0x86f7be);
  (**(code **)(*(long *)pQVar3 + 0x70))();
  local_2c = QSize::width((QSize *)0x86f7dd);
  uVar2 = QWidget::width((QWidget *)0x86f7eb);
  __addr_len = (socklen_t *)(ulong)uVar2;
  local_2c = local_2c - uVar2;
  bVar1 = QWidget::isRightToLeft((QWidget *)0x86f800);
  if (bVar1) {
    local_2c = -local_2c;
  }
  moveGrip(unaff_retaddr,(int)((ulong)lVar4 >> 0x20));
  QEvent::accept(in_RSI,local_2c,__addr,__addr_len);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewGrip::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_UNUSED(event);
    QWidget *parentWidget = (QWidget*)parent();
    int offset = parentWidget->sizeHint().width() - parentWidget->width();
    if (isRightToLeft())
        offset *= -1;
    moveGrip(offset);
    event->accept();
}